

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lwsac.c
# Opt level: O0

void lwsac_unreference(lwsac **head)

{
  lwsac *plVar1;
  lwsac_head *lachead;
  lwsac **head_local;
  
  if (*head != (lwsac *)0x0) {
    plVar1 = *head;
    if ((int)plVar1[1].alloc_size == 0) {
      _lws_log(2,"%s: refcount going below zero\n","lwsac_unreference");
    }
    *(int *)&plVar1[1].alloc_size = (int)plVar1[1].alloc_size + -1;
    _lws_log(0x10,"%s: head %p: (det %d) refcount -> %d\n","lwsac_unreference",*head,
             (ulong)(uint)(int)(char)plVar1[1].ofs,(ulong)(uint)plVar1[1].alloc_size);
    if (((char)plVar1[1].ofs != '\0') && ((int)plVar1[1].alloc_size == 0)) {
      _lws_log(0x10,"%s: head %p: FREED\n","lwsac_unreference",*head);
      lwsac_free(head);
    }
  }
  return;
}

Assistant:

void
lwsac_unreference(struct lwsac **head)
{
	struct lwsac_head *lachead;

	if (!(*head))
		return;

	lachead = (struct lwsac_head *)&(*head)[1];

	if (!lachead->refcount)
		lwsl_warn("%s: refcount going below zero\n", __func__);

	lachead->refcount--;

	lwsl_debug("%s: head %p: (det %d) refcount -> %d\n",
		    __func__, *head, lachead->detached, lachead->refcount);

	if (lachead->detached && !lachead->refcount) {
		lwsl_debug("%s: head %p: FREED\n", __func__, *head);
		lwsac_free(head);
	}
}